

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRulePlaceholderExpander.cxx
# Opt level: O1

string * __thiscall
cmRulePlaceholderExpander::ExpandVariable
          (string *__return_storage_ptr__,cmRulePlaceholderExpander *this,string *variable)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmOutputConverter *pcVar2;
  int iVar3;
  iterator iVar4;
  long *plVar5;
  size_t sVar6;
  string *psVar7;
  long lVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  size_type *psVar11;
  char *pcVar12;
  _Base_ptr p_Var13;
  char *pcVar14;
  pointer pcVar15;
  _Base_ptr __rhs;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view source;
  string_view str;
  string_view str_00;
  string targetBase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  mapped_type *local_50;
  mapped_type *local_48;
  mapped_type *local_40;
  mapped_type *local_38;
  
  if ((this->ReplaceValues->LinkFlags != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->LinkFlags;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->Manifests != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->Manifests;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->Flags != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->Flags;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->Source != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->Source;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->DynDepFile != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->DynDepFile;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->PreprocessedSource != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->PreprocessedSource;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->AssemblySource != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->AssemblySource;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->Object != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->Object;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->ObjectDir != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->ObjectDir;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->ObjectFileDir != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->ObjectFileDir;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->Objects != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->Objects;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->ObjectsQuoted != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->ObjectsQuoted;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->CudaCompileMode != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->CudaCompileMode;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->AIXExports != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->AIXExports;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->ISPCHeader != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->ISPCHeader;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->Defines != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->Defines;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->Includes != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->Includes;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->SwiftLibraryName != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->SwiftLibraryName;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->SwiftModule != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->SwiftModule;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->SwiftModuleName != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->SwiftModuleName;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->SwiftSources != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->SwiftSources;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->TargetPDB != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->TargetPDB;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->TargetCompilePDB != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->TargetCompilePDB;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->DependencyFile != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->DependencyFile;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->DependencyTarget != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->DependencyTarget;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->Fatbinary != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->Fatbinary;
    goto LAB_003df43b;
  }
  if ((this->ReplaceValues->RegisterFile != (char *)0x0) &&
     (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
    pcVar14 = this->ReplaceValues->RegisterFile;
    goto LAB_003df43b;
  }
  if (this->ReplaceValues->Target == (char *)0x0) {
LAB_003df0dc:
    iVar3 = std::__cxx11::string::compare((char *)variable);
    if ((iVar3 != 0) &&
       ((iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 != 0 &&
        (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 != 0)))) {
      if ((this->ReplaceValues->LinkLibraries != (char *)0x0) &&
         (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
        pcVar14 = this->ReplaceValues->LinkLibraries;
LAB_003df43b:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,pcVar14,(allocator<char> *)&targetBase);
        return __return_storage_ptr__;
      }
      if ((this->ReplaceValues->Language != (char *)0x0) &&
         (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
        pcVar14 = this->ReplaceValues->Language;
        goto LAB_003df43b;
      }
      if ((this->ReplaceValues->CMTargetName != (char *)0x0) &&
         (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
        pcVar14 = this->ReplaceValues->CMTargetName;
        goto LAB_003df43b;
      }
      if ((this->ReplaceValues->CMTargetType != (char *)0x0) &&
         (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
        pcVar14 = this->ReplaceValues->CMTargetType;
        goto LAB_003df43b;
      }
      if ((this->ReplaceValues->Output != (char *)0x0) &&
         (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
        pcVar14 = this->ReplaceValues->Output;
        goto LAB_003df43b;
      }
      iVar3 = std::__cxx11::string::compare((char *)variable);
      if (iVar3 == 0) {
        pcVar2 = this->OutputConverter;
        psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        source._M_str = (psVar7->_M_dataplus)._M_p;
        source._M_len = psVar7->_M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (__return_storage_ptr__,pcVar2,source,SHELL);
        return __return_storage_ptr__;
      }
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(this->Compilers)._M_t,variable);
      if ((_Rb_tree_header *)iVar4._M_node == &(this->Compilers)._M_t._M_impl.super__Rb_tree_header)
      {
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&(this->VariableMappings)._M_t,variable);
        if ((_Rb_tree_header *)iVar4._M_node ==
            &(this->VariableMappings)._M_t._M_impl.super__Rb_tree_header) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar15 = (variable->_M_dataplus)._M_p;
          p_Var13 = (_Base_ptr)variable->_M_string_length;
        }
        else {
          lVar8 = std::__cxx11::string::find((char *)variable,0x6a3a87,0);
          if (lVar8 == -1) {
            cmOutputConverter::ConvertToOutputForExisting
                      (__return_storage_ptr__,this->OutputConverter,(string *)(iVar4._M_node + 2),
                       SHELL);
            if (this->ReplaceValues->Launcher == (char *)0x0) {
              return __return_storage_ptr__;
            }
            iVar3 = std::__cxx11::string::compare((char *)variable);
            if (iVar3 != 0) {
              return __return_storage_ptr__;
            }
            pcVar14 = this->ReplaceValues->Launcher;
            targetBase._M_dataplus._M_p = (pointer)strlen(pcVar14);
            targetBase.field_2._M_allocated_capacity = 1;
            targetBase.field_2._8_8_ = (long)"\'\nfailed with:\n " + 0xf;
            views_00._M_len = 3;
            views_00._M_array = (iterator)&targetBase;
            targetBase._M_string_length = (size_type)pcVar14;
            cmCatViews_abi_cxx11_(&local_70,views_00);
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p == &local_70.field_2) {
              return __return_storage_ptr__;
            }
            goto LAB_003e0000;
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar15 = *(pointer *)(iVar4._M_node + 2);
          p_Var13 = iVar4._M_node[2]._M_parent;
        }
LAB_003df5e8:
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar15,
                   (pointer)((long)&p_Var13->_M_color + (long)pcVar15));
        return __return_storage_ptr__;
      }
      pcVar2 = this->OutputConverter;
      __rhs = iVar4._M_node + 2;
      std::operator+(&local_70,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      this_00 = &this->VariableMappings;
      paVar1 = &targetBase.field_2;
      psVar11 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar11) {
        targetBase.field_2._M_allocated_capacity = *psVar11;
        targetBase.field_2._8_8_ = plVar5[3];
        targetBase._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        targetBase.field_2._M_allocated_capacity = *psVar11;
        targetBase._M_dataplus._M_p = (pointer)*plVar5;
      }
      targetBase._M_string_length = plVar5[1];
      *plVar5 = (long)psVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&targetBase);
      cmOutputConverter::ConvertToOutputForExisting(__return_storage_ptr__,pcVar2,pmVar9,SHELL);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetBase._M_dataplus._M_p != paVar1) {
        operator_delete(targetBase._M_dataplus._M_p,targetBase.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_70,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar11 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar11) {
        targetBase.field_2._M_allocated_capacity = *psVar11;
        targetBase.field_2._8_8_ = plVar5[3];
        targetBase._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        targetBase.field_2._M_allocated_capacity = *psVar11;
        targetBase._M_dataplus._M_p = (pointer)*plVar5;
      }
      targetBase._M_string_length = plVar5[1];
      *plVar5 = (long)psVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_38 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_00,&targetBase);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetBase._M_dataplus._M_p != paVar1) {
        operator_delete(targetBase._M_dataplus._M_p,targetBase.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_70,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar11 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar11) {
        targetBase.field_2._M_allocated_capacity = *psVar11;
        targetBase.field_2._8_8_ = plVar5[3];
        targetBase._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        targetBase.field_2._M_allocated_capacity = *psVar11;
        targetBase._M_dataplus._M_p = (pointer)*plVar5;
      }
      targetBase._M_string_length = plVar5[1];
      *plVar5 = (long)psVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_40 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_00,&targetBase);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetBase._M_dataplus._M_p != paVar1) {
        operator_delete(targetBase._M_dataplus._M_p,targetBase.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_70,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar11 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar11) {
        targetBase.field_2._M_allocated_capacity = *psVar11;
        targetBase.field_2._8_8_ = plVar5[3];
        targetBase._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        targetBase.field_2._M_allocated_capacity = *psVar11;
        targetBase._M_dataplus._M_p = (pointer)*plVar5;
      }
      targetBase._M_string_length = plVar5[1];
      *plVar5 = (long)psVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_50 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_00,&targetBase);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetBase._M_dataplus._M_p != paVar1) {
        operator_delete(targetBase._M_dataplus._M_p,targetBase.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_70,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar11 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar11) {
        targetBase.field_2._M_allocated_capacity = *psVar11;
        targetBase.field_2._8_8_ = plVar5[3];
        targetBase._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        targetBase.field_2._M_allocated_capacity = *psVar11;
        targetBase._M_dataplus._M_p = (pointer)*plVar5;
      }
      targetBase._M_string_length = plVar5[1];
      *plVar5 = (long)psVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_48 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_00,&targetBase);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetBase._M_dataplus._M_p != paVar1) {
        operator_delete(targetBase._M_dataplus._M_p,targetBase.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_70,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar11 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar11) {
        targetBase.field_2._M_allocated_capacity = *psVar11;
        targetBase.field_2._8_8_ = plVar5[3];
        targetBase._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        targetBase.field_2._M_allocated_capacity = *psVar11;
        targetBase._M_dataplus._M_p = (pointer)*plVar5;
      }
      targetBase._M_string_length = plVar5[1];
      *plVar5 = (long)psVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&targetBase);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetBase._M_dataplus._M_p != paVar1) {
        operator_delete(targetBase._M_dataplus._M_p,targetBase.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_70,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar11 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar11) {
        targetBase.field_2._M_allocated_capacity = *psVar11;
        targetBase.field_2._8_8_ = plVar5[3];
        targetBase._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        targetBase.field_2._M_allocated_capacity = *psVar11;
        targetBase._M_dataplus._M_p = (pointer)*plVar5;
      }
      targetBase._M_string_length = plVar5[1];
      *plVar5 = (long)psVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_00,&targetBase);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetBase._M_dataplus._M_p != paVar1) {
        operator_delete(targetBase._M_dataplus._M_p,targetBase.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      iVar3 = std::__cxx11::string::compare((char *)__rhs);
      if ((iVar3 == 0) && (pcVar14 = this->ReplaceValues->Launcher, pcVar14 != (char *)0x0)) {
        targetBase._M_dataplus._M_p = (pointer)strlen(pcVar14);
        targetBase.field_2._M_allocated_capacity = 1;
        targetBase.field_2._8_8_ = (long)"\'\nfailed with:\n " + 0xf;
        views._M_len = 3;
        views._M_array = (iterator)&targetBase;
        targetBase._M_string_length = (size_type)pcVar14;
        cmCatViews_abi_cxx11_(&local_70,views);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_38->_M_string_length != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(local_38->_M_dataplus)._M_p);
      }
      if ((local_40->_M_string_length != 0) && (local_50->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(local_50->_M_dataplus)._M_p);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(local_40->_M_dataplus)._M_p);
      }
      if ((local_48->_M_string_length != 0) && (pmVar9->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(pmVar9->_M_dataplus)._M_p);
        str._M_str = (local_48->_M_dataplus)._M_p;
        str._M_len = local_48->_M_string_length;
        cmOutputConverter::EscapeForShell_abi_cxx11_
                  (&targetBase,this->OutputConverter,str,true,false,false,false,false);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)targetBase._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)targetBase._M_dataplus._M_p != paVar1) {
          operator_delete(targetBase._M_dataplus._M_p,targetBase.field_2._M_allocated_capacity + 1);
        }
      }
      targetBase._M_string_length = 0;
      targetBase.field_2._M_allocated_capacity =
           targetBase.field_2._M_allocated_capacity & 0xffffffffffffff00;
      targetBase._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_assign((string *)&targetBase);
      if ((targetBase._M_string_length != 0) && (pmVar10->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(pmVar10->_M_dataplus)._M_p);
        str_00._M_str = targetBase._M_dataplus._M_p;
        str_00._M_len = targetBase._M_string_length;
        cmOutputConverter::EscapeForShell_abi_cxx11_
                  (&local_70,this->OutputConverter,str_00,true,false,false,false,false);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      local_70.field_2._M_allocated_capacity = targetBase.field_2._M_allocated_capacity;
      local_70._M_dataplus._M_p = targetBase._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetBase._M_dataplus._M_p == paVar1) {
        return __return_storage_ptr__;
      }
      goto LAB_003e0000;
    }
    if (this->ReplaceValues->TargetSOName != (char *)0x0) {
      iVar3 = std::__cxx11::string::compare((char *)variable);
      if (iVar3 == 0) {
        pcVar14 = this->ReplaceValues->TargetSOName;
        goto LAB_003df43b;
      }
      iVar3 = std::__cxx11::string::compare((char *)variable);
      if ((iVar3 == 0) && (pcVar14 = this->ReplaceValues->SONameFlag, pcVar14 != (char *)0x0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        sVar6 = strlen(pcVar14);
        pcVar12 = pcVar14 + sVar6;
        goto LAB_003df4d5;
      }
      if ((this->ReplaceValues->TargetInstallNameDir != (char *)0x0) &&
         (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
        pcVar14 = this->ReplaceValues->TargetInstallNameDir;
        goto LAB_003df43b;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar12 = "";
    pcVar14 = "";
    goto LAB_003df4d5;
  }
  iVar3 = std::__cxx11::string::compare((char *)variable);
  if (iVar3 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,this->ReplaceValues->Target,
               (allocator<char> *)&targetBase);
    if (__return_storage_ptr__->_M_string_length == 0) {
      return __return_storage_ptr__;
    }
    if (*(__return_storage_ptr__->_M_dataplus)._M_p == '\"') {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,'\x01');
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  iVar3 = std::__cxx11::string::compare((char *)variable);
  if (iVar3 != 0) {
    if ((this->ReplaceValues->LanguageCompileFlags != (char *)0x0) &&
       (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
      pcVar14 = this->ReplaceValues->LanguageCompileFlags;
      goto LAB_003df43b;
    }
    if ((this->ReplaceValues->Target != (char *)0x0) &&
       (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 == 0)) {
      pcVar14 = this->ReplaceValues->Target;
      goto LAB_003df43b;
    }
    iVar3 = std::__cxx11::string::compare((char *)variable);
    if (iVar3 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar15 = (this->TargetImpLib)._M_dataplus._M_p;
      p_Var13 = (_Base_ptr)(this->TargetImpLib)._M_string_length;
      goto LAB_003df5e8;
    }
    iVar3 = std::__cxx11::string::compare((char *)variable);
    if (iVar3 == 0) {
      pcVar14 = this->ReplaceValues->TargetVersionMajor;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)variable);
      if (iVar3 != 0) {
        if ((this->ReplaceValues->Target == (char *)0x0) ||
           (iVar3 = std::__cxx11::string::compare((char *)variable), iVar3 != 0)) goto LAB_003df0dc;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targetBase,this->ReplaceValues->Target,(allocator<char> *)&local_70);
        lVar8 = std::__cxx11::string::rfind((char)&targetBase,0x2e);
        if (lVar8 == -1) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)targetBase._M_dataplus._M_p == &targetBase.field_2) {
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 targetBase.field_2._M_allocated_capacity;
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = targetBase.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = targetBase._M_dataplus._M_p;
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 targetBase.field_2._M_allocated_capacity;
          }
          __return_storage_ptr__->_M_string_length = targetBase._M_string_length;
          targetBase._M_string_length = 0;
          targetBase.field_2._M_allocated_capacity =
               targetBase.field_2._M_allocated_capacity & 0xffffffffffffff00;
          targetBase._M_dataplus._M_p = (pointer)&targetBase.field_2;
        }
        else {
          std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&targetBase);
        }
        goto LAB_003dfff2;
      }
      pcVar14 = this->ReplaceValues->TargetVersionMinor;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    }
    if (pcVar14 == (char *)0x0) {
      pcVar14 = "0";
      pcVar12 = "";
    }
    else {
      sVar6 = strlen(pcVar14);
      pcVar12 = pcVar14 + sVar6;
    }
LAB_003df4d5:
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar14,pcVar12);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,this->ReplaceValues->Target,
             (allocator<char> *)&targetBase);
  if (__return_storage_ptr__->_M_string_length < 3) {
    return __return_storage_ptr__;
  }
  pcVar14 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if (*pcVar14 != '\"') {
    return __return_storage_ptr__;
  }
  if (pcVar14[__return_storage_ptr__->_M_string_length - 1] != '\"') {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)&targetBase,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&targetBase);
LAB_003dfff2:
  local_70.field_2._M_allocated_capacity = targetBase.field_2._M_allocated_capacity;
  local_70._M_dataplus._M_p = targetBase._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetBase._M_dataplus._M_p == &targetBase.field_2) {
    return __return_storage_ptr__;
  }
LAB_003e0000:
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmRulePlaceholderExpander::ExpandVariable(
  std::string const& variable)
{
  if (this->ReplaceValues->LinkFlags) {
    if (variable == "LINK_FLAGS") {
      return this->ReplaceValues->LinkFlags;
    }
  }
  if (this->ReplaceValues->Manifests) {
    if (variable == "MANIFESTS") {
      return this->ReplaceValues->Manifests;
    }
  }
  if (this->ReplaceValues->Flags) {
    if (variable == "FLAGS") {
      return this->ReplaceValues->Flags;
    }
  }

  if (this->ReplaceValues->Source) {
    if (variable == "SOURCE") {
      return this->ReplaceValues->Source;
    }
  }
  if (this->ReplaceValues->DynDepFile) {
    if (variable == "DYNDEP_FILE") {
      return this->ReplaceValues->DynDepFile;
    }
  }
  if (this->ReplaceValues->PreprocessedSource) {
    if (variable == "PREPROCESSED_SOURCE") {
      return this->ReplaceValues->PreprocessedSource;
    }
  }
  if (this->ReplaceValues->AssemblySource) {
    if (variable == "ASSEMBLY_SOURCE") {
      return this->ReplaceValues->AssemblySource;
    }
  }
  if (this->ReplaceValues->Object) {
    if (variable == "OBJECT") {
      return this->ReplaceValues->Object;
    }
  }
  if (this->ReplaceValues->ObjectDir) {
    if (variable == "OBJECT_DIR") {
      return this->ReplaceValues->ObjectDir;
    }
  }
  if (this->ReplaceValues->ObjectFileDir) {
    if (variable == "OBJECT_FILE_DIR") {
      return this->ReplaceValues->ObjectFileDir;
    }
  }
  if (this->ReplaceValues->Objects) {
    if (variable == "OBJECTS") {
      return this->ReplaceValues->Objects;
    }
  }
  if (this->ReplaceValues->ObjectsQuoted) {
    if (variable == "OBJECTS_QUOTED") {
      return this->ReplaceValues->ObjectsQuoted;
    }
  }
  if (this->ReplaceValues->CudaCompileMode) {
    if (variable == "CUDA_COMPILE_MODE") {
      return this->ReplaceValues->CudaCompileMode;
    }
  }
  if (this->ReplaceValues->AIXExports) {
    if (variable == "AIX_EXPORTS") {
      return this->ReplaceValues->AIXExports;
    }
  }
  if (this->ReplaceValues->ISPCHeader) {
    if (variable == "ISPC_HEADER") {
      return this->ReplaceValues->ISPCHeader;
    }
  }
  if (this->ReplaceValues->Defines && variable == "DEFINES") {
    return this->ReplaceValues->Defines;
  }
  if (this->ReplaceValues->Includes && variable == "INCLUDES") {
    return this->ReplaceValues->Includes;
  }
  if (this->ReplaceValues->SwiftLibraryName) {
    if (variable == "SWIFT_LIBRARY_NAME") {
      return this->ReplaceValues->SwiftLibraryName;
    }
  }
  if (this->ReplaceValues->SwiftModule) {
    if (variable == "SWIFT_MODULE") {
      return this->ReplaceValues->SwiftModule;
    }
  }
  if (this->ReplaceValues->SwiftModuleName) {
    if (variable == "SWIFT_MODULE_NAME") {
      return this->ReplaceValues->SwiftModuleName;
    }
  }
  if (this->ReplaceValues->SwiftSources) {
    if (variable == "SWIFT_SOURCES") {
      return this->ReplaceValues->SwiftSources;
    }
  }
  if (this->ReplaceValues->TargetPDB) {
    if (variable == "TARGET_PDB") {
      return this->ReplaceValues->TargetPDB;
    }
  }
  if (this->ReplaceValues->TargetCompilePDB) {
    if (variable == "TARGET_COMPILE_PDB") {
      return this->ReplaceValues->TargetCompilePDB;
    }
  }
  if (this->ReplaceValues->DependencyFile) {
    if (variable == "DEP_FILE") {
      return this->ReplaceValues->DependencyFile;
    }
  }
  if (this->ReplaceValues->DependencyTarget) {
    if (variable == "DEP_TARGET") {
      return this->ReplaceValues->DependencyTarget;
    }
  }
  if (this->ReplaceValues->Fatbinary) {
    if (variable == "FATBINARY") {
      return this->ReplaceValues->Fatbinary;
    }
  }
  if (this->ReplaceValues->RegisterFile) {
    if (variable == "REGISTER_FILE") {
      return this->ReplaceValues->RegisterFile;
    }
  }

  if (this->ReplaceValues->Target) {
    if (variable == "TARGET_QUOTED") {
      std::string targetQuoted = this->ReplaceValues->Target;
      if (!targetQuoted.empty() && targetQuoted.front() != '\"') {
        targetQuoted = '\"';
        targetQuoted += this->ReplaceValues->Target;
        targetQuoted += '\"';
      }
      return targetQuoted;
    }
    if (variable == "TARGET_UNQUOTED") {
      std::string unquoted = this->ReplaceValues->Target;
      std::string::size_type sz = unquoted.size();
      if (sz > 2 && unquoted.front() == '\"' && unquoted.back() == '\"') {
        unquoted = unquoted.substr(1, sz - 2);
      }
      return unquoted;
    }
    if (this->ReplaceValues->LanguageCompileFlags) {
      if (variable == "LANGUAGE_COMPILE_FLAGS") {
        return this->ReplaceValues->LanguageCompileFlags;
      }
    }
    if (this->ReplaceValues->Target) {
      if (variable == "TARGET") {
        return this->ReplaceValues->Target;
      }
    }
    if (variable == "TARGET_IMPLIB") {
      return this->TargetImpLib;
    }
    if (variable == "TARGET_VERSION_MAJOR") {
      if (this->ReplaceValues->TargetVersionMajor) {
        return this->ReplaceValues->TargetVersionMajor;
      }
      return "0";
    }
    if (variable == "TARGET_VERSION_MINOR") {
      if (this->ReplaceValues->TargetVersionMinor) {
        return this->ReplaceValues->TargetVersionMinor;
      }
      return "0";
    }
    if (this->ReplaceValues->Target) {
      if (variable == "TARGET_BASE") {
        // Strip the last extension off the target name.
        std::string targetBase = this->ReplaceValues->Target;
        std::string::size_type pos = targetBase.rfind('.');
        if (pos != std::string::npos) {
          return targetBase.substr(0, pos);
        }
        return targetBase;
      }
    }
  }
  if (variable == "TARGET_SONAME" || variable == "SONAME_FLAG" ||
      variable == "TARGET_INSTALLNAME_DIR") {
    // All these variables depend on TargetSOName
    if (this->ReplaceValues->TargetSOName) {
      if (variable == "TARGET_SONAME") {
        return this->ReplaceValues->TargetSOName;
      }
      if (variable == "SONAME_FLAG" && this->ReplaceValues->SONameFlag) {
        return this->ReplaceValues->SONameFlag;
      }
      if (this->ReplaceValues->TargetInstallNameDir &&
          variable == "TARGET_INSTALLNAME_DIR") {
        return this->ReplaceValues->TargetInstallNameDir;
      }
    }
    return "";
  }
  if (this->ReplaceValues->LinkLibraries) {
    if (variable == "LINK_LIBRARIES") {
      return this->ReplaceValues->LinkLibraries;
    }
  }
  if (this->ReplaceValues->Language) {
    if (variable == "LANGUAGE") {
      return this->ReplaceValues->Language;
    }
  }
  if (this->ReplaceValues->CMTargetName) {
    if (variable == "TARGET_NAME") {
      return this->ReplaceValues->CMTargetName;
    }
  }
  if (this->ReplaceValues->CMTargetType) {
    if (variable == "TARGET_TYPE") {
      return this->ReplaceValues->CMTargetType;
    }
  }
  if (this->ReplaceValues->Output) {
    if (variable == "OUTPUT") {
      return this->ReplaceValues->Output;
    }
  }
  if (variable == "CMAKE_COMMAND") {
    return this->OutputConverter->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
  }

  auto compIt = this->Compilers.find(variable);

  if (compIt != this->Compilers.end()) {
    std::string ret = this->OutputConverter->ConvertToOutputForExisting(
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER"]);
    std::string const& compilerArg1 =
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER_ARG1"];
    std::string const& compilerTarget =
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER_TARGET"];
    std::string const& compilerOptionTarget =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_TARGET"];
    std::string const& compilerExternalToolchain =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILER_EXTERNAL_TOOLCHAIN"];
    std::string const& compilerOptionExternalToolchain =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN"];
    std::string const& compilerOptionSysroot =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_SYSROOT"];

    if (compIt->second == this->ReplaceValues->Language &&
        this->ReplaceValues->Launcher) {
      // Add launcher as part of expansion so that it always appears
      // immediately before the command itself, regardless of whether the
      // overall rule template contains other content at the front.
      ret = cmStrCat(this->ReplaceValues->Launcher, " ", ret);
    }

    // if there are required arguments to the compiler add it
    // to the compiler string
    if (!compilerArg1.empty()) {
      ret += " ";
      ret += compilerArg1;
    }
    if (!compilerTarget.empty() && !compilerOptionTarget.empty()) {
      ret += " ";
      ret += compilerOptionTarget;
      ret += compilerTarget;
    }
    if (!compilerExternalToolchain.empty() &&
        !compilerOptionExternalToolchain.empty()) {
      ret += " ";
      ret += compilerOptionExternalToolchain;
      ret +=
        this->OutputConverter->EscapeForShell(compilerExternalToolchain, true);
    }
    std::string sysroot;
    // Some platforms may use separate sysroots for compiling and linking.
    // If we detect link flags, then we pass the link sysroot instead.
    // FIXME: Use a more robust way to detect link line expansion.
    if (this->ReplaceValues->LinkFlags) {
      sysroot = this->LinkerSysroot;
    } else {
      sysroot = this->CompilerSysroot;
    }
    if (!sysroot.empty() && !compilerOptionSysroot.empty()) {
      ret += " ";
      ret += compilerOptionSysroot;
      ret += this->OutputConverter->EscapeForShell(sysroot, true);
    }
    return ret;
  }

  auto mapIt = this->VariableMappings.find(variable);
  if (mapIt != this->VariableMappings.end()) {
    if (variable.find("_FLAG") == std::string::npos) {
      std::string ret =
        this->OutputConverter->ConvertToOutputForExisting(mapIt->second);

      if (this->ReplaceValues->Launcher && variable == "CMAKE_LINKER") {
        // Add launcher as part of expansion so that it always appears
        // immediately before the command itself, regardless of whether the
        // overall rule template contains other content at the front.
        ret = cmStrCat(this->ReplaceValues->Launcher, " ", ret);
      }

      return ret;
    }
    return mapIt->second;
  }
  return variable;
}